

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O0

string * __thiscall OB::Parg::print_version_abi_cxx11_(string *__return_storage_ptr__,Parg *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Parg *local_18;
  Parg *this_local;
  
  local_18 = this;
  this_local = (Parg *)__return_storage_ptr__;
  std::operator+(&local_58,&this->name_," v");
  std::operator+(&local_38,&local_58,&this->version_);
  std::operator+(__return_storage_ptr__,&local_38,"\n");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string print_version() const
  {
    return name_ + " v" + version_ + "\n";
  }